

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
construct<pbrt::ProjectionLight,pbrt::Transform&,pbrt::MediumHandle&,pbrt::Image,pbrt::RGBColorSpace_const*&,float&,float&,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
          (polymorphic_allocator<std::byte> *this,ProjectionLight *p,Transform *args,
          MediumHandle *args_1,Image *args_2,RGBColorSpace **args_3,float *args_4,float *args_5,
          float *args_6,polymorphic_allocator<std::byte> *args_7)

{
  MediumInterface *in_RDX;
  MediumHandle *in_RSI;
  Float in_stack_0000051c;
  Float in_stack_00000520;
  Float in_stack_00000524;
  RGBColorSpace *in_stack_00000528;
  Image *in_stack_00000530;
  MediumInterface *in_stack_00000538;
  Transform *in_stack_00000540;
  ProjectionLight *in_stack_00000548;
  Allocator in_stack_00000550;
  MediumHandle *in_stack_fffffffffffffe58;
  Image *this_00;
  Image *in_stack_fffffffffffffe88;
  Image *in_stack_fffffffffffffe90;
  
  this_00 = (Image *)&stack0xffffffffffffffb8;
  pbrt::MediumHandle::MediumHandle((MediumHandle *)this_00,in_stack_fffffffffffffe58);
  pbrt::MediumInterface::MediumInterface(in_RDX,in_RSI);
  pbrt::Image::Image(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  pbrt::ProjectionLight::ProjectionLight
            (in_stack_00000548,in_stack_00000540,in_stack_00000538,in_stack_00000530,
             in_stack_00000528,in_stack_00000524,in_stack_00000520,in_stack_0000051c,
             in_stack_00000550);
  pbrt::Image::~Image(this_00);
  return;
}

Assistant:

void construct(T *p, Args &&... args) {
        ::new ((void *)p) T(std::forward<Args>(args)...);
    }